

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mapinfo.cpp
# Opt level: O0

void __thiscall level_info_t::ClearDefered(level_info_t *this)

{
  acsdefered_t *paVar1;
  acsdefered_t *next;
  acsdefered_t *def;
  level_info_t *this_local;
  
  paVar1 = this->defered;
  while (next = paVar1, next != (acsdefered_t *)0x0) {
    paVar1 = next->next;
    if (next != (acsdefered_t *)0x0) {
      operator_delete(next,0x20);
    }
  }
  this->defered = (acsdefered_t *)0x0;
  return;
}

Assistant:

void level_info_t::ClearDefered()
{
	acsdefered_t *def = defered;
	while (def)
	{
		acsdefered_t *next = def->next;
		delete def;
		def = next;
	}
	defered = NULL;
}